

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParserReset(Parse *pParse)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  sqlite3DbFree(db_00,pParse->aLabel);
  sqlite3ExprListDelete(db_00,pParse->pConstExpr);
  if (db_00 != (sqlite3 *)0x0) {
    (db_00->lookaside).bDisable = (db_00->lookaside).bDisable - (uint)pParse->disableLookaside;
  }
  pParse->disableLookaside = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParserReset(Parse *pParse){
  sqlite3 *db = pParse->db;
  sqlite3DbFree(db, pParse->aLabel);
  sqlite3ExprListDelete(db, pParse->pConstExpr);
  if( db ){
    assert( db->lookaside.bDisable >= pParse->disableLookaside );
    db->lookaside.bDisable -= pParse->disableLookaside;
  }
  pParse->disableLookaside = 0;
}